

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  Text *this_00;
  undefined8 *in_RDI;
  TextAttributes *in_stack_000000a0;
  string *in_stack_000000a8;
  Text *in_stack_000000b0;
  Colour colourGuard;
  undefined4 in_stack_ffffffffffffff28;
  Code in_stack_ffffffffffffff2c;
  Colour *in_stack_ffffffffffffff30;
  Text *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  string local_88 [16];
  AssertionResult *in_stack_ffffffffffffff88;
  
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_ffffffffffffff88);
  if (bVar1) {
    std::operator<<((ostream *)*in_RDI,"with expansion:\n");
    Colour::Colour(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    AssertionResult::getExpandedExpression_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    TextAttributes::TextAttributes((TextAttributes *)&stack0xffffffffffffff48);
    TextAttributes::setIndent((TextAttributes *)&stack0xffffffffffffff48,2);
    Text::Text(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    this_00 = (Text *)operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::operator<<((ostream *)this_00,"\n");
    Text::~Text(this_00);
    std::__cxx11::string::~string(local_88);
    Colour::~Colour((Colour *)0x1f230a);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }